

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

void COST_SENSITIVE::output_example(vw *all,example *ec)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  shared_data *this;
  int *piVar4;
  code *pcVar5;
  long lVar6;
  bool bVar7;
  v_array<COST_SENSITIVE::wclass> *this_00;
  wclass **ppwVar8;
  ostream *poVar9;
  int **ppiVar10;
  ulong uVar11;
  size_t sVar12;
  wclass *pwVar13;
  long in_RSI;
  long *in_RDI;
  substring sVar14;
  wclass cl_1;
  uint i;
  stringstream outputStringStream;
  substring ss_pred;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  wclass *cl;
  wclass *__end2;
  wclass *__begin2;
  v_array<COST_SENSITIVE::wclass> *__range2;
  float min;
  float chosen_loss;
  size_t pred;
  float loss;
  label *ld;
  undefined8 in_stack_fffffffffffffc88;
  namedlabels *in_stack_fffffffffffffc90;
  void *in_stack_fffffffffffffc98;
  string local_2b8 [36];
  undefined8 local_294;
  undefined8 local_28c;
  uint local_284;
  stringstream local_280 [16];
  ostream local_270;
  undefined8 local_f8;
  namedlabels *pnStack_f0;
  void *local_e8;
  undefined8 uStack_e0;
  uint32_t in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  multi_ex *in_stack_ffffffffffffff38;
  example *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff4f;
  vw *in_stack_ffffffffffffff50;
  char *local_a0;
  char *local_98;
  int *local_60;
  wclass *local_40;
  float local_30;
  float local_2c;
  float local_1c;
  
  this_00 = (v_array<COST_SENSITIVE::wclass> *)(in_RSI + 0x6828);
  local_1c = 0.0;
  bVar7 = test_label(in_stack_fffffffffffffc98);
  if (!bVar7) {
    uVar2 = *(uint32_t *)(in_RSI + 0x6850);
    local_2c = 3.4028235e+38;
    local_30 = 3.4028235e+38;
    ppwVar8 = v_array<COST_SENSITIVE::wclass>::begin(this_00);
    local_40 = *ppwVar8;
    ppwVar8 = v_array<COST_SENSITIVE::wclass>::end(this_00);
    for (; local_40 != *ppwVar8; local_40 = local_40 + 1) {
      if (local_40->class_index == uVar2) {
        local_2c = local_40->x;
      }
      if (local_40->x < local_30) {
        local_30 = local_40->x;
      }
    }
    if ((local_2c == 3.4028235e+38) && (!NAN(local_2c))) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?"
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    local_1c = local_2c - local_30;
  }
  this = (shared_data *)*in_RDI;
  bVar1 = *(byte *)(in_RSI + 0x68c8);
  bVar7 = test_label(in_stack_fffffffffffffc98);
  shared_data::update(this,(bool)(bVar1 & 1),(bool)((bVar7 ^ 0xffU) & 1),local_1c,1.0,
                      *(size_t *)(in_RSI + 0x68a0));
  ppiVar10 = v_array<int>::begin((v_array<int> *)(in_RDI + 0x6a2));
  local_60 = *ppiVar10;
  ppiVar10 = v_array<int>::end((v_array<int> *)(in_RDI + 0x6a2));
  piVar4 = *ppiVar10;
  for (; local_60 != piVar4; local_60 = local_60 + 1) {
    iVar3 = *local_60;
    if (*(long *)(*in_RDI + 0x70) == 0) {
      in_stack_fffffffffffffc88 = *(undefined8 *)(in_RSI + 0x6878);
      in_stack_fffffffffffffc90 = *(namedlabels **)(in_RSI + 0x6880);
      in_stack_fffffffffffffc98 = *(void **)(in_RSI + 0x6888);
      (*(code *)in_RDI[0x6a7])((float)*(uint *)(in_RSI + 0x6850),0,iVar3);
    }
    else {
      sVar14 = namedlabels::get(in_stack_fffffffffffffc90,
                                (uint32_t)((ulong)in_stack_fffffffffffffc88 >> 0x20));
      pcVar5 = (code *)in_RDI[0x6a8];
      local_a0 = sVar14.begin;
      local_98 = sVar14.end;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff40,local_a0,(long)local_98 - (long)local_a0,
                 (allocator *)&stack0xffffffffffffff3f);
      in_stack_fffffffffffffc88 = *(undefined8 *)(in_RSI + 0x6878);
      in_stack_fffffffffffffc90 = *(namedlabels **)(in_RSI + 0x6880);
      in_stack_fffffffffffffc98 = *(void **)(in_RSI + 0x6888);
      uStack_e0 = *(undefined8 *)(in_RSI + 0x6890);
      local_f8 = in_stack_fffffffffffffc88;
      pnStack_f0 = in_stack_fffffffffffffc90;
      local_e8 = in_stack_fffffffffffffc98;
      (*pcVar5)(iVar3,&stack0xffffffffffffff40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
    }
  }
  if (0 < (int)in_RDI[0x6a6]) {
    std::__cxx11::stringstream::stringstream(local_280);
    local_284 = 0;
    while( true ) {
      uVar11 = (ulong)local_284;
      sVar12 = v_array<COST_SENSITIVE::wclass>::size(this_00);
      if (sVar12 <= uVar11) break;
      pwVar13 = v_array<COST_SENSITIVE::wclass>::operator[](this_00,(ulong)local_284);
      local_294._0_4_ = pwVar13->x;
      local_294._4_4_ = pwVar13->class_index;
      local_28c._0_4_ = pwVar13->partial_prediction;
      local_28c._4_4_ = pwVar13->wap_value;
      if (local_284 != 0) {
        std::operator<<(&local_270,' ');
      }
      poVar9 = (ostream *)std::ostream::operator<<(&local_270,local_294._4_4_);
      poVar9 = std::operator<<(poVar9,':');
      std::ostream::operator<<(poVar9,(float)local_28c);
      local_284 = local_284 + 1;
    }
    pcVar5 = (code *)in_RDI[0x6a8];
    lVar6 = in_RDI[0x6a6];
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffffc98 = *(void **)(in_RSI + 0x6888);
    (*pcVar5)((int)lVar6,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::stringstream::~stringstream(local_280);
  }
  test_label(in_stack_fffffffffffffc98);
  print_update(in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37,in_stack_ffffffffffffff30);
  return;
}

Assistant:

void output_example(vw& all, example& ec)
{
  label& ld = ec.l.cs;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    size_t pred = (size_t)ec.pred.multiclass;

    float chosen_loss = FLT_MAX;
    float min = FLT_MAX;
    for (auto& cl : ld.costs)
    {
      if (cl.class_index == pred)
        chosen_loss = cl.x;
      if (cl.x < min)
        min = cl.x;
    }
    if (chosen_loss == FLT_MAX)
      cerr << "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?" << endl;

    loss = chosen_loss - min;
    // TODO(alberto): add option somewhere to allow using absolute loss instead?
    // loss = chosen_loss;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      wclass cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.class_index << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, test_label(&ec.l.cs), ec, nullptr, false, ec.pred.multiclass);
}